

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha256_Update(SHA256_CTX *context,sha2_byte *data,size_t len)

{
  uint32_t *puVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  uint uVar44;
  long lVar45;
  void *__dest;
  ulong __n;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  
  if (len == 0) {
    return;
  }
  uVar44 = (uint)context->bitcount >> 3 & 0x3f;
  if (uVar44 != 0) {
    __n = (ulong)(0x40 - uVar44);
    __dest = (void *)((long)context->buffer + (ulong)uVar44);
    if (len < __n) {
      memcpy(__dest,data,len);
      goto LAB_0012b30f;
    }
    memcpy(__dest,data,__n);
    context->bitcount = context->bitcount + (ulong)((0x40 - uVar44) * 8);
    lVar45 = 10;
    do {
      auVar47 = *(undefined1 (*) [16])(context->state + lVar45);
      auVar49[1] = 0;
      auVar49[0] = auVar47[8];
      auVar49[2] = auVar47[9];
      auVar49[3] = 0;
      auVar49[4] = auVar47[10];
      auVar49[5] = 0;
      auVar49[6] = auVar47[0xb];
      auVar49[7] = 0;
      auVar49[8] = auVar47[0xc];
      auVar49[9] = 0;
      auVar49[10] = auVar47[0xd];
      auVar49[0xb] = 0;
      auVar49[0xc] = auVar47[0xe];
      auVar49[0xd] = 0;
      auVar49[0xe] = auVar47[0xf];
      auVar49[0xf] = 0;
      auVar49 = pshuflw(auVar49,auVar49,0x1b);
      auVar49 = pshufhw(auVar49,auVar49,0x1b);
      auVar18[0xd] = 0;
      auVar18._0_13_ = auVar47._0_13_;
      auVar18[0xe] = auVar47[7];
      auVar19[0xc] = auVar47[6];
      auVar19._0_12_ = auVar47._0_12_;
      auVar19._13_2_ = auVar18._13_2_;
      auVar20[0xb] = 0;
      auVar20._0_11_ = auVar47._0_11_;
      auVar20._12_3_ = auVar19._12_3_;
      auVar22[10] = auVar47[5];
      auVar22._0_10_ = auVar47._0_10_;
      auVar22._11_4_ = auVar20._11_4_;
      auVar24[9] = 0;
      auVar24._0_9_ = auVar47._0_9_;
      auVar24._10_5_ = auVar22._10_5_;
      auVar26[8] = auVar47[4];
      auVar26._0_8_ = auVar47._0_8_;
      auVar26._9_6_ = auVar24._9_6_;
      auVar38._7_8_ = 0;
      auVar38._0_7_ = auVar26._8_7_;
      auVar40._1_8_ = SUB158(auVar38 << 0x40,7);
      auVar40[0] = auVar47[3];
      auVar40._9_6_ = 0;
      auVar41._1_10_ = SUB1510(auVar40 << 0x30,5);
      auVar41[0] = auVar47[2];
      auVar41._11_4_ = 0;
      auVar30[2] = auVar47[1];
      auVar30._0_2_ = auVar47._0_2_;
      auVar30._3_12_ = SUB1512(auVar41 << 0x20,3);
      auVar47._0_2_ = auVar47._0_2_ & 0xff;
      auVar47._2_13_ = auVar30._2_13_;
      auVar47[0xf] = 0;
      auVar47 = pshuflw(auVar47,auVar47,0x1b);
      auVar47 = pshufhw(auVar47,auVar47,0x1b);
      sVar2 = auVar47._0_2_;
      sVar3 = auVar47._2_2_;
      sVar4 = auVar47._4_2_;
      sVar5 = auVar47._6_2_;
      sVar6 = auVar47._8_2_;
      sVar7 = auVar47._10_2_;
      sVar8 = auVar47._12_2_;
      sVar9 = auVar47._14_2_;
      sVar10 = auVar49._0_2_;
      sVar11 = auVar49._2_2_;
      sVar12 = auVar49._4_2_;
      sVar13 = auVar49._6_2_;
      sVar14 = auVar49._8_2_;
      sVar15 = auVar49._10_2_;
      sVar16 = auVar49._12_2_;
      sVar17 = auVar49._14_2_;
      puVar1 = context->state + lVar45;
      *(char *)puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar47[0] - (0xff < sVar2);
      *(char *)((long)puVar1 + 1) = (0 < sVar3) * (sVar3 < 0x100) * auVar47[2] - (0xff < sVar3);
      *(char *)((long)puVar1 + 2) = (0 < sVar4) * (sVar4 < 0x100) * auVar47[4] - (0xff < sVar4);
      *(char *)((long)puVar1 + 3) = (0 < sVar5) * (sVar5 < 0x100) * auVar47[6] - (0xff < sVar5);
      *(char *)(puVar1 + 1) = (0 < sVar6) * (sVar6 < 0x100) * auVar47[8] - (0xff < sVar6);
      *(char *)((long)puVar1 + 5) = (0 < sVar7) * (sVar7 < 0x100) * auVar47[10] - (0xff < sVar7);
      *(char *)((long)puVar1 + 6) = (0 < sVar8) * (sVar8 < 0x100) * auVar47[0xc] - (0xff < sVar8);
      *(char *)((long)puVar1 + 7) = (0 < sVar9) * (sVar9 < 0x100) * auVar47[0xe] - (0xff < sVar9);
      *(char *)(puVar1 + 2) = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0] - (0xff < sVar10);
      *(char *)((long)puVar1 + 9) = (0 < sVar11) * (sVar11 < 0x100) * auVar49[2] - (0xff < sVar11);
      *(char *)((long)puVar1 + 10) = (0 < sVar12) * (sVar12 < 0x100) * auVar49[4] - (0xff < sVar12);
      *(char *)((long)puVar1 + 0xb) = (0 < sVar13) * (sVar13 < 0x100) * auVar49[6] - (0xff < sVar13)
      ;
      *(char *)(puVar1 + 3) = (0 < sVar14) * (sVar14 < 0x100) * auVar49[8] - (0xff < sVar14);
      *(char *)((long)puVar1 + 0xd) =
           (0 < sVar15) * (sVar15 < 0x100) * auVar49[10] - (0xff < sVar15);
      *(char *)((long)puVar1 + 0xe) =
           (0 < sVar16) * (sVar16 < 0x100) * auVar49[0xc] - (0xff < sVar16);
      *(char *)((long)puVar1 + 0xf) =
           (0 < sVar17) * (sVar17 < 0x100) * auVar49[0xe] - (0xff < sVar17);
      lVar45 = lVar45 + 4;
    } while (lVar45 != 0x1a);
    data = data + __n;
    sha256_Transform(context->state,context->buffer,context->state);
    len = len - __n;
  }
  if (0x3f < len) {
    do {
      uVar31 = *(undefined8 *)data;
      uVar32 = *(undefined8 *)(data + 8);
      uVar33 = *(undefined8 *)(data + 0x10);
      uVar34 = *(undefined8 *)(data + 0x18);
      uVar35 = *(undefined8 *)(data + 0x20);
      uVar36 = *(undefined8 *)(data + 0x28);
      uVar37 = *(undefined8 *)(data + 0x38);
      *(undefined8 *)(context->buffer + 0xc) = *(undefined8 *)(data + 0x30);
      *(undefined8 *)(context->buffer + 0xe) = uVar37;
      *(undefined8 *)(context->buffer + 8) = uVar35;
      *(undefined8 *)(context->buffer + 10) = uVar36;
      *(undefined8 *)(context->buffer + 4) = uVar33;
      *(undefined8 *)(context->buffer + 6) = uVar34;
      *(undefined8 *)context->buffer = uVar31;
      *(undefined8 *)(context->buffer + 2) = uVar32;
      lVar45 = 10;
      do {
        auVar47 = *(undefined1 (*) [16])(context->state + lVar45);
        auVar48[1] = 0;
        auVar48[0] = auVar47[8];
        auVar48[2] = auVar47[9];
        auVar48[3] = 0;
        auVar48[4] = auVar47[10];
        auVar48[5] = 0;
        auVar48[6] = auVar47[0xb];
        auVar48[7] = 0;
        auVar48[8] = auVar47[0xc];
        auVar48[9] = 0;
        auVar48[10] = auVar47[0xd];
        auVar48[0xb] = 0;
        auVar48[0xc] = auVar47[0xe];
        auVar48[0xd] = 0;
        auVar48[0xe] = auVar47[0xf];
        auVar48[0xf] = 0;
        auVar49 = pshuflw(auVar48,auVar48,0x1b);
        auVar49 = pshufhw(auVar49,auVar49,0x1b);
        auVar21[0xd] = 0;
        auVar21._0_13_ = auVar47._0_13_;
        auVar21[0xe] = auVar47[7];
        auVar23[0xc] = auVar47[6];
        auVar23._0_12_ = auVar47._0_12_;
        auVar23._13_2_ = auVar21._13_2_;
        auVar25[0xb] = 0;
        auVar25._0_11_ = auVar47._0_11_;
        auVar25._12_3_ = auVar23._12_3_;
        auVar27[10] = auVar47[5];
        auVar27._0_10_ = auVar47._0_10_;
        auVar27._11_4_ = auVar25._11_4_;
        auVar28[9] = 0;
        auVar28._0_9_ = auVar47._0_9_;
        auVar28._10_5_ = auVar27._10_5_;
        auVar29[8] = auVar47[4];
        auVar29._0_8_ = auVar47._0_8_;
        auVar29._9_6_ = auVar28._9_6_;
        auVar39._7_8_ = 0;
        auVar39._0_7_ = auVar29._8_7_;
        auVar42._1_8_ = SUB158(auVar39 << 0x40,7);
        auVar42[0] = auVar47[3];
        auVar42._9_6_ = 0;
        auVar43._1_10_ = SUB1510(auVar42 << 0x30,5);
        auVar43[0] = auVar47[2];
        auVar43._11_4_ = 0;
        auVar46._3_12_ = SUB1512(auVar43 << 0x20,3);
        auVar46[2] = auVar47[1];
        auVar46[0] = auVar47[0];
        auVar46[1] = 0;
        auVar46[0xf] = 0;
        auVar47 = pshuflw(auVar46,auVar46,0x1b);
        auVar47 = pshufhw(auVar47,auVar47,0x1b);
        sVar2 = auVar47._0_2_;
        sVar3 = auVar47._2_2_;
        sVar4 = auVar47._4_2_;
        sVar5 = auVar47._6_2_;
        sVar6 = auVar47._8_2_;
        sVar7 = auVar47._10_2_;
        sVar8 = auVar47._12_2_;
        sVar9 = auVar47._14_2_;
        sVar10 = auVar49._0_2_;
        sVar11 = auVar49._2_2_;
        sVar12 = auVar49._4_2_;
        sVar13 = auVar49._6_2_;
        sVar14 = auVar49._8_2_;
        sVar15 = auVar49._10_2_;
        sVar16 = auVar49._12_2_;
        sVar17 = auVar49._14_2_;
        puVar1 = context->state + lVar45;
        *(char *)puVar1 = (0 < sVar2) * (sVar2 < 0x100) * auVar47[0] - (0xff < sVar2);
        *(char *)((long)puVar1 + 1) = (0 < sVar3) * (sVar3 < 0x100) * auVar47[2] - (0xff < sVar3);
        *(char *)((long)puVar1 + 2) = (0 < sVar4) * (sVar4 < 0x100) * auVar47[4] - (0xff < sVar4);
        *(char *)((long)puVar1 + 3) = (0 < sVar5) * (sVar5 < 0x100) * auVar47[6] - (0xff < sVar5);
        *(char *)(puVar1 + 1) = (0 < sVar6) * (sVar6 < 0x100) * auVar47[8] - (0xff < sVar6);
        *(char *)((long)puVar1 + 5) = (0 < sVar7) * (sVar7 < 0x100) * auVar47[10] - (0xff < sVar7);
        *(char *)((long)puVar1 + 6) = (0 < sVar8) * (sVar8 < 0x100) * auVar47[0xc] - (0xff < sVar8);
        *(char *)((long)puVar1 + 7) = (0 < sVar9) * (sVar9 < 0x100) * auVar47[0xe] - (0xff < sVar9);
        *(char *)(puVar1 + 2) = (0 < sVar10) * (sVar10 < 0x100) * auVar49[0] - (0xff < sVar10);
        *(char *)((long)puVar1 + 9) = (0 < sVar11) * (sVar11 < 0x100) * auVar49[2] - (0xff < sVar11)
        ;
        *(char *)((long)puVar1 + 10) =
             (0 < sVar12) * (sVar12 < 0x100) * auVar49[4] - (0xff < sVar12);
        *(char *)((long)puVar1 + 0xb) =
             (0 < sVar13) * (sVar13 < 0x100) * auVar49[6] - (0xff < sVar13);
        *(char *)(puVar1 + 3) = (0 < sVar14) * (sVar14 < 0x100) * auVar49[8] - (0xff < sVar14);
        *(char *)((long)puVar1 + 0xd) =
             (0 < sVar15) * (sVar15 < 0x100) * auVar49[10] - (0xff < sVar15);
        *(char *)((long)puVar1 + 0xe) =
             (0 < sVar16) * (sVar16 < 0x100) * auVar49[0xc] - (0xff < sVar16);
        *(char *)((long)puVar1 + 0xf) =
             (0 < sVar17) * (sVar17 < 0x100) * auVar49[0xe] - (0xff < sVar17);
        lVar45 = lVar45 + 4;
      } while (lVar45 != 0x1a);
      sha256_Transform(context->state,context->buffer,context->state);
      context->bitcount = context->bitcount + 0x200;
      len = len - 0x40;
      data = data + 0x40;
    } while (0x3f < len);
  }
  if (len == 0) {
    return;
  }
  memcpy(context->buffer,data,len);
LAB_0012b30f:
  context->bitcount = context->bitcount + len * 8;
  return;
}

Assistant:

void sha256_Update(trezor::SHA256_CTX* context, const sha2_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	usedspace = (context->bitcount >> 3) % SHA256_BLOCK_LENGTH;
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = SHA256_BLOCK_LENGTH - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, freespace);
			context->bitcount += freespace << 3;
			len -= freespace;
			data += freespace;
#if BYTE_ORDER == LITTLE_ENDIAN
			/* Convert TO host byte order */
			for (int j = 0; j < 16; j++) {
				REVERSE32(context->buffer[j],context->buffer[j]);
			}
#endif
			sha256_Transform(context->state, context->buffer, context->state);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(((uint8_t*)context->buffer) + usedspace, data, len);
			context->bitcount += len << 3;
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= SHA256_BLOCK_LENGTH) {
		/* Process as many complete blocks as we can */
		MEMCPY_BCOPY(context->buffer, data, SHA256_BLOCK_LENGTH);
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		for (int j = 0; j < 16; j++) {
			REVERSE32(context->buffer[j],context->buffer[j]);
		}
#endif
		sha256_Transform(context->state, context->buffer, context->state);
		context->bitcount += SHA256_BLOCK_LENGTH << 3;
		len -= SHA256_BLOCK_LENGTH;
		data += SHA256_BLOCK_LENGTH;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->buffer, data, len);
		context->bitcount += len << 3;
	}
}